

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O1

void Bmc_MnaFree(Bmc_Mna_t *p)

{
  int *piVar1;
  
  Cnf_DataFree(p->pCnf);
  if (p->vPiMap != (Vec_Int_t *)0x0) {
    piVar1 = p->vPiMap->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vPiMap->pArray = (int *)0x0;
    }
    if (p->vPiMap != (Vec_Int_t *)0x0) {
      free(p->vPiMap);
      p->vPiMap = (Vec_Int_t *)0x0;
    }
  }
  if (p->vId2Var != (Vec_Int_t *)0x0) {
    piVar1 = p->vId2Var->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vId2Var->pArray = (int *)0x0;
    }
    if (p->vId2Var != (Vec_Int_t *)0x0) {
      free(p->vId2Var);
      p->vId2Var = (Vec_Int_t *)0x0;
    }
  }
  if (p->vInputs != (Vec_Int_t *)0x0) {
    piVar1 = p->vInputs->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vInputs->pArray = (int *)0x0;
    }
    if (p->vInputs != (Vec_Int_t *)0x0) {
      free(p->vInputs);
      p->vInputs = (Vec_Int_t *)0x0;
    }
  }
  if (p->vOutputs != (Vec_Int_t *)0x0) {
    piVar1 = p->vOutputs->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vOutputs->pArray = (int *)0x0;
    }
    if (p->vOutputs != (Vec_Int_t *)0x0) {
      free(p->vOutputs);
      p->vOutputs = (Vec_Int_t *)0x0;
    }
  }
  if (p->vNodes != (Vec_Int_t *)0x0) {
    piVar1 = p->vNodes->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vNodes->pArray = (int *)0x0;
    }
    if (p->vNodes != (Vec_Int_t *)0x0) {
      free(p->vNodes);
      p->vNodes = (Vec_Int_t *)0x0;
    }
  }
  sat_solver_delete(p->pSat);
  if (p != (Bmc_Mna_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Bmc_MnaFree( Bmc_Mna_t * p )
{
    Cnf_DataFree( p->pCnf );
    Vec_IntFreeP( &p->vPiMap );
    Vec_IntFreeP( &p->vId2Var );
    Vec_IntFreeP( &p->vInputs );
    Vec_IntFreeP( &p->vOutputs );
    Vec_IntFreeP( &p->vNodes );
    sat_solver_delete( p->pSat );
    ABC_FREE( p );
}